

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturerLinux.cpp
# Opt level: O3

StatusCode __thiscall
media::EasyScreenCapturerLinux::CaptureScreenAsBmp
          (EasyScreenCapturerLinux *this,string *fileName,uint startX,uint startY,uint width,
          uint height)

{
  StatusCode SVar1;
  undefined4 in_register_00000014;
  CaptureBmpData bmp;
  CaptureBmpData local_58;
  
  local_58.m_pixels.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.m_pixels.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SVar1 = (*(this->super_EasyScreenCapturer)._vptr_EasyScreenCapturer[4])
                    (this,&local_58,CONCAT44(in_register_00000014,startX));
  if (SVar1 == CAPTURE_OK) {
    SaveBmpBitsAsFile(this,fileName,&local_58);
  }
  if (local_58.m_pixels.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.m_pixels.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return SVar1;
}

Assistant:

StatusCode EasyScreenCapturerLinux::CaptureScreenAsBmp(
    const std::string &fileName, uint startX, uint startY, uint width,
    uint height)
{
  CaptureBmpData bmp;
  auto res = CaptureScreen(bmp, startX, startY, width, height);
  if (res != StatusCode::CAPTURE_OK)
  {
    return res;
  }

  //保存文件
  res = SaveBmpBitsAsFile(fileName, bmp);
  return res;
}